

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O1

shared_ptr<kratos::Stmt> __thiscall kratos::Generator::get_stmt(Generator *this,uint32_t index)

{
  size_type *psVar1;
  pointer ppVar2;
  ulong uVar3;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  shared_ptr<kratos::Stmt> sVar5;
  
  uVar3 = in_RDX & 0xffffffff;
  _Var4._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (CONCAT44(in_register_00000034,index) + 0x1f8);
  if (uVar3 < (ulong)(*(long *)(CONCAT44(in_register_00000034,index) + 0x200) - (long)_Var4._M_pi >>
                     4)) {
    (this->super_IRNode)._vptr_IRNode = _Var4._M_pi[uVar3]._vptr__Sp_counted_base;
    ppVar2 = *(pointer *)&_Var4._M_pi[uVar3]._M_use_count;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar2;
    if (ppVar2 != (pointer)0x0) {
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(ppVar2->first)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  else {
    (this->super_IRNode)._vptr_IRNode = (_func_int **)0x0;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Stmt>)
         sVar5.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Stmt> get_stmt(uint32_t index) {
        return index < stmts_.size() ? stmts_[index] : nullptr;
    }